

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitPLTerm(EExpr *__return_storage_ptr__,
             ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *this,PLTerm e)

{
  uint uVar1;
  Arguments args;
  long lVar2;
  ulong uVar3;
  size_type __n;
  vector<double,_std::allocator<double>_> slopes;
  vector<double,_std::allocator<double>_> breakpoints;
  _Vector_base<double,_std::allocator<double>_> local_1a8;
  _Vector_base<double,_std::allocator<double>_> local_190;
  PLSlopes local_178;
  PLConParams local_138;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  local_c8;
  
  uVar1 = *(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                          impl_ + 4);
  __n = (size_type)(int)uVar1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1a8,__n + 1,
             (allocator_type *)&local_c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_190,__n,(allocator_type *)&local_c8);
  lVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 * 8 != lVar2; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)local_1a8._M_impl.super__Vector_impl_data._M_start + lVar2) =
         *(undefined8 *)
          ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
           0x10 + lVar2 * 2);
    *(undefined8 *)((long)local_190._M_impl.super__Vector_impl_data._M_start + lVar2) =
         *(undefined8 *)
          ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
           0x18 + lVar2 * 2);
  }
  local_1a8._M_impl.super__Vector_impl_data._M_finish[-1] =
       *(double *)
        ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ + 0x10
        + __n * 0x10);
  args._M_elems[0] =
       (_Type)Convert2Var(this,(Expr)((ExprBase *)
                                     ((long)e.
                                            super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                            super_ExprBase.impl_ + 8))->impl_);
  PLSlopes::PLSlopes<std::vector<double,std::allocator<double>>&>
            (&local_178,(vector<double,_std::allocator<double>_> *)&local_190,
             (vector<double,_std::allocator<double>_> *)&local_1a8,0.0,0.0);
  PLConParams::PLConParams(&local_138,&local_178);
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  ::CustomFunctionalConstraint(&local_c8,args,&local_138);
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
            (__return_storage_ptr__,
             (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
              *)this,&local_c8);
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  ::~CustomFunctionalConstraint(&local_c8);
  PLConParams::~PLConParams(&local_138);
  PLSlopes::~PLSlopes(&local_178);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_190);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

EExpr VisitPLTerm(PLTerm e) {
    int num_breakpoints = e.num_breakpoints();
    std::vector<double> slopes(num_breakpoints+1), breakpoints(num_breakpoints);
    for (int i = 0; i < num_breakpoints; ++i) {
      slopes[i] = e.slope(i);
      breakpoints[i] = e.breakpoint(i);
    }
    slopes.back() = e.slope(num_breakpoints);
    return AssignResult2Args( PLConstraint(
          PLConstraint::Arguments{ Convert2Var(e.arg()) },
          PLConstraint::Parameters{
                                  PLSlopes{
                                    breakpoints, slopes, 0.0, 0.0 } } ) );
  }